

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void recursive_clone(CHAR_DATA *ch,OBJ_DATA *obj,OBJ_DATA *clone)

{
  bool bVar1;
  OBJ_DATA *obj_00;
  OBJ_DATA *in_RDX;
  CHAR_DATA *in_RSI;
  OBJ_DATA *in_RDI;
  OBJ_DATA *c_obj;
  OBJ_DATA *t_obj;
  int in_stack_0000008c;
  OBJ_INDEX_DATA *in_stack_00000090;
  CHAR_DATA *ch_00;
  
  for (ch_00 = in_RSI->master; ch_00 != (CHAR_DATA *)0x0; ch_00 = ch_00->next_in_room) {
    bVar1 = obj_check(ch_00,(OBJ_DATA *)0x5938c5);
    if (bVar1) {
      obj_00 = create_object(in_stack_00000090,in_stack_0000008c);
      clone_object(c_obj,in_RDI);
      obj_to_obj(obj_00,(OBJ_DATA *)ch_00);
      recursive_clone(in_RSI,in_RDX,obj_00);
    }
  }
  return;
}

Assistant:

void recursive_clone(CHAR_DATA *ch, OBJ_DATA *obj, OBJ_DATA *clone)
{
	OBJ_DATA *t_obj;

	for (OBJ_DATA *c_obj = obj->contains; c_obj != nullptr; c_obj = c_obj->next_content)
	{
		if (obj_check(ch, c_obj))
		{
			t_obj = create_object(c_obj->pIndexData, 0);
			clone_object(c_obj, t_obj);
			obj_to_obj(t_obj, clone);
			recursive_clone(ch, c_obj, t_obj);
		}
	}
}